

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_LoadBlockMap(MapData *map)

{
  size_t __n;
  FileReader *pFVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  int iVar4;
  ulong *puVar5;
  undefined1 (*pauVar6) [16];
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  char *format;
  uint uVar10;
  int iVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_XMM1 [16];
  
  pFVar1 = map->MapLumps[10].Reader;
  if (pFVar1 == (FileReader *)0x0) {
    iVar11 = 0;
  }
  else {
    iVar11 = (int)pFVar1->Length;
  }
  if ((((ForceNodeBuild) || (genblockmap.Value)) || (iVar11 == 0 || 0x1ffff < iVar11)) ||
     (iVar4 = DArgs::CheckParm(Args,"-blockmap",1), iVar4 != 0)) {
LAB_00565969:
    DPrintf(4,"Generating BLOCKMAP\n");
    P_CreateBlockMap();
  }
  else {
    uVar9 = iVar11 / 2;
    puVar5 = (ulong *)operator_new__((long)iVar11);
    pFVar1 = map->MapLumps[10].Reader;
    lVar14 = pFVar1->Length;
    map->file = pFVar1;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,0,0);
    (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,puVar5,(long)(int)lVar14)
    ;
    uVar7 = 0xffffffffffffffff;
    if (-2 < iVar11) {
      uVar7 = (long)(int)uVar9 * 4;
    }
    pauVar6 = (undefined1 (*) [16])operator_new__(uVar7);
    uVar7 = *puVar5;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar7;
    auVar16 = pshuflw(in_XMM1,auVar16,0x60);
    auVar17._4_4_ = auVar16._4_4_ >> 0x10;
    auVar17._0_4_ = auVar16._0_4_ >> 0x10;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar7;
    auVar2._12_2_ = (short)(uVar7 >> 0x30);
    auVar3._8_2_ = (short)(uVar7 >> 0x20);
    auVar3._0_8_ = uVar7;
    auVar3._10_4_ = auVar2._10_4_;
    auVar17._8_6_ = auVar3._8_6_;
    auVar17._14_2_ = 0;
    blockmaplump = (int *)pauVar6;
    *pauVar6 = auVar17;
    if (9 < iVar11) {
      uVar7 = 5;
      if (5 < (int)uVar9) {
        uVar7 = (ulong)uVar9;
      }
      uVar8 = 4;
      do {
        uVar10 = (uint)*(ushort *)((long)puVar5 + uVar8 * 2);
        if (uVar10 == 0xffff) {
          uVar10 = 0xffffffff;
        }
        *(uint *)((long)*pauVar6 + uVar8 * 4) = uVar10;
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
    operator_delete__(puVar5);
    uVar7 = (ulong)blockmaplump[3];
    if (0 < (long)uVar7) {
      uVar10 = blockmaplump[2];
      uVar8 = 0;
      format = "P_VerifyBlockMap: block offset overflow\n";
      bVar15 = false;
      do {
        if (0 < (int)uVar10) {
          uVar13 = 0;
          do {
            if (blockmaplump + (int)uVar9 <= blockmaplump + uVar8 * uVar10 + uVar13 + 4) {
LAB_00565bb6:
              Printf(2,format);
              if (bVar15) goto LAB_00565981;
              goto LAB_00565969;
            }
            iVar11 = blockmaplump[uVar8 * uVar10 + uVar13 + 4];
            lVar14 = (long)iVar11;
            if ((lVar14 < 4) || ((int)uVar9 <= iVar11)) {
              format = "P_VerifyBlockMap: list offset overflow\n";
              goto LAB_00565bb6;
            }
            piVar12 = blockmaplump + lVar14;
            while (*piVar12 != -1) {
              piVar12 = piVar12 + 1;
              if (blockmaplump + (int)uVar9 <= piVar12) {
                format = "P_VerifyBlockMap: open blocklist\n";
                goto LAB_00565bb6;
              }
            }
            iVar11 = blockmaplump[lVar14];
            if (iVar11 != -1) {
              piVar12 = blockmaplump + lVar14 + 1;
              do {
                if ((iVar11 < 0) || (numlines <= iVar11)) {
                  format = "P_VerifyBlockMap: index >= numlines\n";
                  goto LAB_00565bb6;
                }
                iVar11 = *piVar12;
                piVar12 = piVar12 + 1;
              } while (iVar11 != -1);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar10);
        }
        uVar8 = uVar8 + 1;
        bVar15 = uVar7 <= uVar8;
      } while (uVar8 != uVar7);
    }
  }
LAB_00565981:
  piVar12 = blockmaplump;
  bmaporgx = (double)*blockmaplump;
  bmaporgy = (double)blockmaplump[1];
  bmapwidth = blockmaplump[2];
  bmapheight = blockmaplump[3];
  __n = (long)(bmapheight * bmapwidth) * 8;
  uVar7 = 0xffffffffffffffff;
  if (-1 < bmapheight * bmapwidth) {
    uVar7 = __n;
  }
  blocklinks = (FBlockNode **)operator_new__(uVar7);
  memset(blocklinks,0,__n);
  blockmap = piVar12 + 4;
  return;
}

Assistant:

void P_LoadBlockMap (MapData * map)
{
	int count = map->Size(ML_BLOCKMAP);

	if (ForceNodeBuild || genblockmap ||
		count/2 >= 0x10000 || count == 0 ||
		Args->CheckParm("-blockmap")
		)
	{
		DPrintf (DMSG_SPAMMY, "Generating BLOCKMAP\n");
		P_CreateBlockMap ();
	}
	else
	{
		BYTE *data = new BYTE[count];
		map->Read(ML_BLOCKMAP, data);
		const short *wadblockmaplump = (short *)data;
		int i;

		count/=2;
		blockmaplump = new int[count];

		// killough 3/1/98: Expand wad blockmap into larger internal one,
		// by treating all offsets except -1 as unsigned and zero-extending
		// them. This potentially doubles the size of blockmaps allowed,
		// because Doom originally considered the offsets as always signed.

		blockmaplump[0] = LittleShort(wadblockmaplump[0]);
		blockmaplump[1] = LittleShort(wadblockmaplump[1]);
		blockmaplump[2] = (DWORD)(LittleShort(wadblockmaplump[2])) & 0xffff;
		blockmaplump[3] = (DWORD)(LittleShort(wadblockmaplump[3])) & 0xffff;

		for (i = 4; i < count; i++)
		{
			short t = LittleShort(wadblockmaplump[i]);          // killough 3/1/98
			blockmaplump[i] = t == -1 ? (DWORD)0xffffffff : (DWORD) t & 0xffff;
		}
		delete[] data;

		if (!P_VerifyBlockMap(count))
		{
			DPrintf (DMSG_SPAMMY, "Generating BLOCKMAP\n");
			P_CreateBlockMap();
		}

	}

	bmaporgx = blockmaplump[0];
	bmaporgy = blockmaplump[1];
	bmapwidth = blockmaplump[2];
	bmapheight = blockmaplump[3];

	// clear out mobj chains
	count = bmapwidth*bmapheight;
	blocklinks = new FBlockNode *[count];
	memset (blocklinks, 0, count*sizeof(*blocklinks));
	blockmap = blockmaplump+4;
}